

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O0

node_t __thiscall lsim::Simulator::connect_pins(Simulator *this,pin_t pin_a,pin_t pin_b)

{
  size_type sVar1;
  reference pvVar2;
  value_type node_b;
  value_type node_a;
  pin_t pin_b_local;
  pin_t pin_a_local;
  Simulator *this_local;
  
  if (pin_a == pin_b) {
    __assert_fail("pin_a != pin_b",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                  ,0x31,"node_t lsim::Simulator::connect_pins(pin_t, pin_t)");
  }
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_pin_nodes);
  if (sVar1 <= pin_a) {
    __assert_fail("pin_a < m_pin_nodes.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                  ,0x32,"node_t lsim::Simulator::connect_pins(pin_t, pin_t)");
  }
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_pin_nodes);
  if (sVar1 <= pin_b) {
    __assert_fail("pin_b < m_pin_nodes.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                  ,0x33,"node_t lsim::Simulator::connect_pins(pin_t, pin_t)");
  }
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->m_pin_nodes,(ulong)pin_a);
  this_local._4_4_ = *pvVar2;
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->m_pin_nodes,(ulong)pin_b);
  if (this_local._4_4_ != *pvVar2) {
    this_local._4_4_ = merge_nodes(this,this_local._4_4_,*pvVar2);
  }
  return this_local._4_4_;
}

Assistant:

node_t Simulator::connect_pins(pin_t pin_a, pin_t pin_b) {
    assert(pin_a != pin_b);
    assert(pin_a < m_pin_nodes.size());
    assert(pin_b < m_pin_nodes.size());

    const auto node_a = m_pin_nodes[pin_a];
    const auto node_b = m_pin_nodes[pin_b];

    if (node_a == node_b) {
        // pins already connected to each other
        return node_a;
    }

    return merge_nodes(node_a, node_b);
}